

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O3

void StartNetwork(bool autoPort)

{
  u_short port;
  undefined7 in_register_00000039;
  u_long trueval;
  undefined8 local_10;
  
  local_10 = 1;
  addterm(CloseNetwork,"CloseNetwork");
  netgame = true;
  multiplayer = true;
  mysocket = UDPsocket();
  port = 0;
  if ((int)CONCAT71(in_register_00000039,autoPort) == 0) {
    port = DOOMPORT;
  }
  BindToLocalPort(mysocket,port);
  ioctl(mysocket,0x5421,&local_10);
  return;
}

Assistant:

void StartNetwork (bool autoPort)
{
	u_long trueval = 1;
#ifdef __WIN32__
	WSADATA wsad;

	if (WSAStartup (0x0101, &wsad))
	{
		I_FatalError ("Could not initialize Windows Sockets");
	}
#endif

	atterm (CloseNetwork);

	netgame = true;
	multiplayer = true;
	
	// create communication socket
	mysocket = UDPsocket ();
	BindToLocalPort (mysocket, autoPort ? 0 : DOOMPORT);
#ifndef __sun
	ioctlsocket (mysocket, FIONBIO, &trueval);
#else
	fcntl(mysocket, F_SETFL, trueval | O_NONBLOCK);
#endif
}